

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_cursor.hpp
# Opt level: O3

void __thiscall
jsoncons::cbor::basic_cbor_cursor<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
reset<std::__cxx11::istringstream&>
          (basic_cbor_cursor<jsoncons::stream_source<unsigned_char>,std::allocator<char>> *this,
          basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> *source)

{
  char cVar1;
  uint6 uStack_26;
  
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
  reset<std::__cxx11::istringstream&>
            ((basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>> *)
             (this + 8),source);
  *(undefined2 *)(this + 0x288) = 3;
  *(ulong *)(this + 0x28a) = (ulong)uStack_26;
  *(undefined8 *)(this + 0x292) = 0;
  *(undefined8 *)(this + 0x298) = 0;
  *(undefined8 *)(this + 0x2a0) = 0;
  *(undefined4 *)(this + 0x2a8) = 0;
  *(undefined4 *)(this + 0x2b0) = 0;
  *(undefined8 *)(this + 0x2b8) = 0;
  *(undefined8 *)(this + 0x2c0) = 0;
  *(undefined8 *)(this + 0x2c8) = 0;
  *(undefined8 *)(this + 0x2d0) = 0;
  *(undefined8 *)(this + 0x2d8) = 0;
  basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::reset
            ((basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_> *)(this + 0x2e0)
            );
  this[0x3b0] = (basic_cbor_cursor<jsoncons::stream_source<unsigned_char>,std::allocator<char>>)0x0;
  cVar1 = (**(code **)(*(long *)this + 0x18))(this);
  if (cVar1 != '\0') {
    return;
  }
  (**(code **)(*(long *)this + 0x38))(this);
  return;
}

Assistant:

void reset(Sourceable&& source)
    {
        parser_.reset(std::forward<Sourceable>(source));
        cursor_visitor_.reset();
        cursor_handler_adaptor_.reset();
        eof_ = false;
        if (!done())
        {
            next();
        }
    }